

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

LoggerInstance * gnilk::Logger::GetInstance(string *name)

{
  iterator iVar1;
  mapped_type *ppLVar2;
  Logger *this;
  mapped_type pLVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>
  local_40;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>_>
          ::find(&loggers_abi_cxx11_._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node == &loggers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    this = (Logger *)operator_new(0x30);
    Logger(this,name);
    pLVar3 = (mapped_type)operator_new(0x10);
    pLVar3->_vptr_LoggerInstance = (_func_int **)&PTR__LoggerInstance_0011c988;
    pLVar3->pLogger = (ILogger *)this;
    std::__cxx11::string::string((string *)&local_40,name);
    local_40.second = pLVar3;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>,std::_Select1st<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,gnilk::LoggerInstance*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>,std::_Select1st<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>>
                *)&loggers_abi_cxx11_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    ppLVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>_>
              ::operator[](&loggers_abi_cxx11_,name);
    pLVar3 = *ppLVar2;
  }
  return pLVar3;
}

Assistant:

LoggerInstance *Logger::GetInstance(const std::string &name) {

    // We need a maximum
	if (loggers.find(name) == loggers.end()) {
		// Have to create logger
		ILogger *pLogger = (ILogger *)new Logger(name);
		LoggerInstance *pInstance = new LoggerInstance(pLogger);
		// TODO: Support for exclude list		
		loggers.insert(std::pair<std::string, LoggerInstance *>(name, pInstance));

		return pInstance;
	}
	return loggers[name];
}